

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::EndColumns(void)

{
  ImGuiWindow *pIVar1;
  ImGuiOldColumns *pIVar2;
  ImGuiOldColumnData *pIVar3;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImU32 col;
  ulong uVar7;
  int n_1;
  long lVar8;
  ImGuiID id;
  ImGuiCol idx;
  int n;
  int column_index;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  undefined4 extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  bool held;
  bool hovered;
  uint local_bc;
  undefined1 local_b8 [16];
  ulong local_a0;
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  ImGuiContext *local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImRect column_hit_rect;
  
  local_80 = GImGui;
  GImGui->CurrentWindow->WriteAccessed = true;
  pIVar1 = local_80->CurrentWindow;
  pIVar2 = (pIVar1->DC).CurrentColumns;
  PopItemWidth();
  if (1 < pIVar2->Count) {
    PopClipRect();
    ImDrawListSplitter::Merge(&pIVar2->Splitter,pIVar1->DrawList);
  }
  local_bc = pIVar2->Flags;
  fVar12 = (pIVar1->DC).CursorPos.y;
  uVar11 = -(uint)(fVar12 <= pIVar2->LineMaxY);
  local_98 = (float)(~uVar11 & (uint)fVar12 | (uint)pIVar2->LineMaxY & uVar11);
  pIVar2->LineMaxY = local_98;
  (pIVar1->DC).CursorPos.y = local_98;
  if ((local_bc & 0x10) == 0) {
    (pIVar1->DC).CursorMaxPos.x = pIVar2->HostCursorMaxPosX;
  }
  if (((local_bc & 1) == 0) && (pIVar1->SkipItems == false)) {
    fVar12 = (pIVar1->ClipRect).Min.y;
    uVar11 = -(uint)(fVar12 <= pIVar2->HostCursorPosY);
    fVar13 = (float)(~uVar11 & (uint)fVar12 | (uint)pIVar2->HostCursorPosY & uVar11);
    fVar12 = (pIVar1->ClipRect).Max.y;
    if (fVar12 <= local_98) {
      local_98 = fVar12;
    }
    uStack_94 = 0;
    uStack_90 = 0;
    uStack_8c = 0;
    local_a0 = 0xffffffffffffffff;
    lVar10 = 0x24;
    for (uVar9 = 1; uVar7 = (ulong)pIVar2->Count, (long)uVar9 < (long)uVar7; uVar9 = uVar9 + 1) {
      pIVar3 = (pIVar2->Columns).Data;
      local_b8._0_4_ = (pIVar1->Pos).x;
      fVar12 = GetColumnOffset((int)uVar9);
      local_b8._0_4_ = fVar12 + (float)local_b8._0_4_;
      id = pIVar2->ID + (int)uVar9;
      column_hit_rect.Min.x = (float)local_b8._0_4_ + -4.0;
      local_b8._4_4_ = extraout_XMM0_Db;
      local_b8._8_4_ = extraout_XMM0_Dc;
      local_b8._12_4_ = extraout_XMM0_Dd;
      column_hit_rect.Max.x = (float)local_b8._0_4_ + 4.0;
      column_hit_rect.Max.y = local_98;
      column_hit_rect.Min.y = fVar13;
      bVar6 = ItemAdd(&column_hit_rect,id,(ImRect *)0x0,8);
      if (bVar6) {
        hovered = false;
        held = false;
        if ((local_bc & 2) == 0) {
          ButtonBehavior(&column_hit_rect,id,&hovered,&held,0);
          if (hovered == false) {
            if ((held & 1U) != 0) {
              local_80->MouseCursor = 4;
              goto LAB_0020b139;
            }
          }
          else {
            local_80->MouseCursor = 4;
            if ((held & 1U) != 0) {
LAB_0020b139:
              if ((*(byte *)((long)&pIVar3->OffsetNorm + lVar10) & 2) == 0) {
                local_a0 = uVar9;
              }
              local_a0 = local_a0 & 0xffffffff;
            }
          }
        }
        idx = hovered + 0x1b;
        if ((held & 1U) != 0) {
          idx = 0x1d;
        }
        col = GetColorU32(idx,1.0);
        local_78.x = (float)(int)(float)local_b8._0_4_;
        local_78.y = local_98;
        local_70.x = local_78.x;
        local_70.y = fVar13 + 1.0;
        ImDrawList::AddLine(pIVar1->DrawList,&local_70,&local_78,col,1.0);
      }
      lVar10 = lVar10 + 0x1c;
    }
    column_index = (int)local_a0;
    if (column_index != -1) {
      if (pIVar2->IsBeingResized == false) {
        lVar10 = 4;
        for (lVar8 = 0; lVar8 <= (int)uVar7; lVar8 = lVar8 + 1) {
          pIVar3 = (pIVar2->Columns).Data;
          *(undefined4 *)((long)&pIVar3->OffsetNorm + lVar10) =
               *(undefined4 *)((long)pIVar3 + lVar10 + -4);
          uVar7 = (ulong)(uint)pIVar2->Count;
          lVar10 = lVar10 + 0x1c;
        }
      }
      pIVar2->IsBeingResized = true;
      pIVar5 = GImGui;
      local_b8 = ZEXT416((uint)((((GImGui->IO).MousePos.x - (GImGui->ActiveIdClickOffset).x) + 4.0)
                               - (GImGui->CurrentWindow->Pos).x));
      fVar13 = GetColumnOffset(column_index + -1);
      fVar12 = (pIVar5->Style).ColumnsMinSpacing;
      fVar13 = fVar13 + fVar12;
      uVar11 = -(uint)(fVar13 <= (float)local_b8._0_4_);
      fVar13 = (float)(~uVar11 & (uint)fVar13 | local_b8._0_4_ & uVar11);
      if ((pIVar2->Flags & 4) != 0) {
        local_b8._4_4_ = local_b8._4_4_ & extraout_XMM0_Db_00;
        local_b8._0_4_ = fVar13;
        local_b8._8_4_ = local_b8._8_4_ & extraout_XMM0_Dc_00;
        local_b8._12_4_ = local_b8._12_4_ & extraout_XMM0_Dd_00;
        local_98 = fVar12;
        fVar12 = GetColumnOffset(column_index + 1);
        fVar13 = (float)local_b8._0_4_;
        if (fVar12 - local_98 <= (float)local_b8._0_4_) {
          fVar13 = fVar12 - local_98;
        }
      }
      SetColumnOffset(column_index,fVar13);
    }
    bVar6 = column_index != -1;
  }
  else {
    bVar6 = false;
  }
  pIVar2->IsBeingResized = bVar6;
  IVar4 = (pIVar1->ParentWorkRect).Max;
  (pIVar1->WorkRect).Min = (pIVar1->ParentWorkRect).Min;
  (pIVar1->WorkRect).Max = IVar4;
  IVar4 = (pIVar2->HostBackupParentWorkRect).Max;
  (pIVar1->ParentWorkRect).Min = (pIVar2->HostBackupParentWorkRect).Min;
  (pIVar1->ParentWorkRect).Max = IVar4;
  (pIVar1->DC).CurrentColumns = (ImGuiOldColumns *)0x0;
  (pIVar1->DC).ColumnsOffset.x = 0.0;
  (pIVar1->DC).CursorPos.x = (float)(int)((pIVar1->Pos).x + (pIVar1->DC).Indent.x + 0.0);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    if (columns->Count > 1)
    {
        PopClipRect();
        columns->Splitter.Merge(window->DrawList);
    }

    const ImGuiOldColumnFlags flags = columns->Flags;
    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(flags & ImGuiOldColumnFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->HostCursorMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    // The IsBeingResized flag ensure we preserve pre-resize columns width so back-and-forth are not lossy
    bool is_being_resized = false;
    if (!(flags & ImGuiOldColumnFlags_NoBorder) && !window->SkipItems)
    {
        // We clip Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.
        const float y1 = ImMax(columns->HostCursorPosY, window->ClipRect.Min.y);
        const float y2 = ImMin(window->DC.CursorPos.y, window->ClipRect.Max.y);
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            ImGuiOldColumnData* column = &columns->Columns[n];
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hit_hw = COLUMNS_HIT_RECT_HALF_WIDTH;
            const ImRect column_hit_rect(ImVec2(x - column_hit_hw, y1), ImVec2(x + column_hit_hw, y2));
            if (!ItemAdd(column_hit_rect, column_id, NULL, ImGuiItemFlags_NoNav))
                continue;

            bool hovered = false, held = false;
            if (!(flags & ImGuiOldColumnFlags_NoResize))
            {
                ButtonBehavior(column_hit_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(column->Flags & ImGuiOldColumnFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = IM_FLOOR(x);
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->WorkRect = window->ParentWorkRect;
    window->ParentWorkRect = columns->HostBackupParentWorkRect;
    window->DC.CurrentColumns = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
}